

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helix.cc
# Opt level: O3

int helix_session_process_packet(helix_session_t session,char *buf,size_t len)

{
  int iVar1;
  char *local_18;
  size_t local_10;
  
  local_18 = buf;
  local_10 = len;
  iVar1 = (**(code **)(*(long *)session + 0x30))(session,&local_18);
  return iVar1;
}

Assistant:

int helix_session_process_packet(helix_session_t session, const char* buf, size_t len)
{
    try {
        return unwrap(session)->process_packet(helix::net::packet_view{buf, len});
    } catch (const helix::unknown_message_type& e) {
        return HELIX_ERROR_UNKNOWN_MESSAGE_TYPE;
    } catch (const helix::truncated_packet_error& e) {
        return HELIX_ERROR_TRUNCATED_PACKET;
    } catch (...) {
       return HELIX_ERROR_UNKNOWN;
    }
}